

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QPointer<QWidget>>::emplace<QPointer<QWidget>>
          (QMovableArrayOps<QPointer<QWidget>> *this,qsizetype i,QPointer<QWidget> *args)

{
  undefined8 *puVar1;
  Data *pDVar2;
  QObject *pQVar3;
  long lVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  Inserter local_70;
  QWeakPointer<QObject> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int **)this != (int *)0x0) && (**(int **)this < 2)) {
    if (*(long *)(this + 0x10) == i) {
      qVar5 = QArrayDataPointer<QPointer<QWidget>_>::freeSpaceAtEnd
                        ((QArrayDataPointer<QPointer<QWidget>_> *)this);
      if (qVar5 == 0) goto LAB_00429591;
      pQVar3 = (args->wp).value;
      puVar1 = (undefined8 *)(*(long *)(this + 8) + *(long *)(this + 0x10) * 0x10);
      *puVar1 = (args->wp).d;
      puVar1[1] = pQVar3;
      (args->wp).d = (Data *)0x0;
      (args->wp).value = (QObject *)0x0;
LAB_00429683:
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      goto LAB_0042963b;
    }
LAB_00429591:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QPointer<QWidget>_>::freeSpaceAtBegin
                        ((QArrayDataPointer<QPointer<QWidget>_> *)this);
      if (qVar5 != 0) {
        lVar4 = *(long *)(this + 8);
        pQVar3 = (args->wp).value;
        *(Data **)(lVar4 + -0x10) = (args->wp).d;
        *(QObject **)(lVar4 + -8) = pQVar3;
        (args->wp).d = (Data *)0x0;
        (args->wp).value = (QObject *)0x0;
        *(long *)(this + 8) = *(long *)(this + 8) + -0x10;
        goto LAB_00429683;
      }
    }
  }
  pDVar2 = (args->wp).d;
  pQVar3 = (args->wp).value;
  (args->wp).d = (Data *)0x0;
  (args->wp).value = (QObject *)0x0;
  lVar4 = *(long *)(this + 0x10);
  QArrayDataPointer<QPointer<QWidget>_>::detachAndGrow
            ((QArrayDataPointer<QPointer<QWidget>_> *)this,(uint)(i == 0 && lVar4 != 0),1,
             (QPointer<QWidget> **)0x0,(QArrayDataPointer<QPointer<QWidget>_> *)0x0);
  if (i == 0 && lVar4 != 0) {
    lVar4 = *(long *)(this + 8);
    *(Data **)(lVar4 + -0x10) = pDVar2;
    *(QObject **)(lVar4 + -8) = pQVar3;
    *(long *)(this + 8) = lVar4 + -0x10;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  else {
    QMovableArrayOps<QPointer<QWidget>_>::Inserter::Inserter
              (&local_70,(QArrayDataPointer<QPointer<QWidget>_> *)this,i,1);
    ((local_70.displaceFrom)->wp).d = pDVar2;
    ((local_70.displaceFrom)->wp).value = pQVar3;
    local_70.displaceFrom = local_70.displaceFrom + 1;
    (local_70.data)->size = (local_70.data)->size + local_70.nInserts;
  }
  local_48.value = (QObject *)0x0;
  local_48.d = (Data *)0x0;
  QWeakPointer<QObject>::~QWeakPointer(&local_48);
LAB_0042963b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }